

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O1

void __thiscall pstore::broker::recorder::record(recorder *this,message_type *cmd)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  not_null<const_void_*> local_28;
  
  local_38._M_owns = false;
  local_38._M_device = &this->mut_;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  local_28.ptr_ = cmd;
  pstore::gsl::not_null<const_void_*>::ensure_invariant(&local_28);
  (*(this->file_).super_file_base._vptr_file_base[0xe])(&this->file_,local_28.ptr_,0x100);
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void recorder::record (brokerface::message_type const & cmd) {
            std::unique_lock<decltype (mut_)> const lock (mut_);
            file_.write (cmd);
        }